

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

uint uv_available_parallelism(void)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  uv__cpu_constraint c;
  cpu_set_t set;
  
  c.quota_per_period = 0;
  c.period_length = 0;
  c.proportions = 0.0;
  set.__bits[0] = 0;
  set.__bits[1] = 0;
  set.__bits[2] = 0;
  set.__bits[3] = 0;
  set.__bits[4] = 0;
  set.__bits[5] = 0;
  set.__bits[6] = 0;
  set.__bits[7] = 0;
  set.__bits[8] = 0;
  set.__bits[9] = 0;
  set.__bits[10] = 0;
  set.__bits[0xb] = 0;
  set.__bits[0xc] = 0;
  set.__bits[0xd] = 0;
  set.__bits[0xe] = 0;
  set.__bits[0xf] = 0;
  iVar1 = sched_getaffinity(0,0x80,(cpu_set_t *)&set);
  if (iVar1 == 0) {
    iVar1 = __sched_cpucount(0x80,(cpu_set_t *)&set);
    lVar3 = (long)iVar1;
  }
  else {
    lVar3 = sysconf(0x54);
  }
  iVar1 = uv__get_constrained_cpu(&c);
  if ((0 < c.period_length && iVar1 == 0) &&
     (dVar4 = ((double)c.quota_per_period / (double)c.period_length) * c.proportions,
     dVar4 < (double)lVar3)) {
    lVar3 = (long)dVar4;
  }
  uVar2 = 1;
  if (1 < lVar3) {
    uVar2 = (uint)lVar3;
  }
  return uVar2;
}

Assistant:

unsigned int uv_available_parallelism(void) {
#ifdef __linux__
  cpu_set_t set;
  long rc;
  double rc_with_cgroup;
  uv__cpu_constraint c = {0, 0, 0.0};

  memset(&set, 0, sizeof(set));

  /* sysconf(_SC_NPROCESSORS_ONLN) in musl calls sched_getaffinity() but in
   * glibc it's... complicated... so for consistency try sched_getaffinity()
   * before falling back to sysconf(_SC_NPROCESSORS_ONLN).
   */
  if (0 == sched_getaffinity(0, sizeof(set), &set))
    rc = CPU_COUNT(&set);
  else
    rc = sysconf(_SC_NPROCESSORS_ONLN);
    
  if (uv__get_constrained_cpu(&c) == 0 && c.period_length > 0) {
    rc_with_cgroup = (double)c.quota_per_period / c.period_length * c.proportions;
    if (rc_with_cgroup < rc)
      rc = (long)rc_with_cgroup; /* Casting is safe since rc_with_cgroup < rc < LONG_MAX */
  }
  if (rc < 1) 
    rc = 1;

  return (unsigned) rc;
#elif defined(__MVS__)
  int rc;

  rc = __get_num_online_cpus();
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#else  /* __linux__ */
  long rc;

  rc = sysconf(_SC_NPROCESSORS_ONLN);
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#endif  /* __linux__ */
}